

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

int Abc_SclCountNonBufferFanoutsInt(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  undefined4 local_28;
  undefined4 local_24;
  int Counter;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  local_28 = 0;
  iVar1 = Abc_ObjIsBuffer(pObj);
  if (iVar1 == 0) {
    pObj_local._4_4_ = 1;
  }
  else {
    for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_24);
      iVar1 = Abc_SclCountNonBufferFanoutsInt(pObj_00);
      local_28 = iVar1 + local_28;
    }
    pObj_local._4_4_ = local_28;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_SclCountNonBufferFanoutsInt( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Counter = 0;
    if ( !Abc_ObjIsBuffer(pObj) )
        return 1;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Counter += Abc_SclCountNonBufferFanoutsInt( pFanout );
    return Counter;
}